

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O3

void ht_task_scheduler_tick(HT_TaskScheduler *task_scheduler)

{
  undefined8 *ptr;
  int iVar1;
  HT_TimestampNs HVar2;
  size_t n;
  
  if ((task_scheduler->tasks).size != 0) {
    n = 0;
    do {
      ptr = (undefined8 *)(task_scheduler->tasks).data[n];
      HVar2 = ht_monotonic_clock_get_timestamp();
      if ((ulong)ptr[3] <= HVar2) {
        iVar1 = (*(code *)*ptr)(ptr[1]);
        if (iVar1 == 0) {
          ht_bag_void_ptr_remove_nth(&task_scheduler->tasks,n);
          ht_free(ptr);
          n = n - 1;
        }
        else {
          if (*(int *)((long)ptr + 0x24) == 0) {
            HVar2 = ptr[3];
          }
          else {
            HVar2 = ht_monotonic_clock_get_timestamp();
          }
          ptr[3] = HVar2 + ptr[2];
        }
      }
      n = n + 1;
    } while (n < (task_scheduler->tasks).size);
  }
  return;
}

Assistant:

void
ht_task_scheduler_tick(HT_TaskScheduler* task_scheduler)
{
    size_t i;
    HT_Boolean result;

    for (i = 0; i < task_scheduler->tasks.size; i++)
    {
        HT_Task* task = HT_TASK(task_scheduler->tasks.data[i]);
        HT_TimestampNs now_ts = ht_monotonic_clock_get_timestamp();
        if (task->next_action_ts > now_ts)
        {
            continue;
        }

        result = task->callback(task->user_data);

        if (result == HT_FALSE)
        {
            ht_bag_void_ptr_remove_nth(&task_scheduler->tasks, i);
            ht_free(task);
            i--;
        }
        else
        {
            task->next_action_ts = task->mode == HT_TASK_SCHEDULING_IGNORE_DELAYS ?
                        task->next_action_ts + task->period :
                        ht_monotonic_clock_get_timestamp() + task->period;
        }
    }
}